

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::
BasicRateTargetingSVC2TL1SLScreenDropFrame1920x1080Test(DatarateTestSVC *this)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  ParamType *pPVar4;
  SEARCH_METHODS *message;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  AssertHelper local_120;
  AssertHelper local_118;
  undefined1 local_110 [16];
  long local_100 [2];
  Y4mVideoSource local_f0;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 0x32;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 100;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 0x32;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x34;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0x1e;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  local_110._0_8_ = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"screendata.1920_1080.y4m","")
  ;
  libaom_test::Y4mVideoSource::Y4mVideoSource(&local_f0,(string *)local_110,0,0x3c);
  if ((long *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  pPVar4 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4f6c8 +
                (long)(pPVar4->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->screen_mode_ = 1;
  this->number_temporal_layers_ = 2;
  this->number_spatial_layers_ = 1;
  uVar1 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = (uVar1 * 0x3c) / 100;
  this->target_layer_bitrate_[1] = uVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&local_f0);
    }
    bVar3 = local_110[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (bVar3 == false) {
      local_120.data_._0_4_ = this->mismatch_nframes_;
      local_118.data_._0_4_ = 0x96;
      testing::internal::CmpHelperLE<unsigned_int,unsigned_int>
                ((internal *)local_110,"GetMismatchFrames()","150u",(uint *)&local_120,
                 (uint *)&local_118);
      if (local_110[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_120);
        if ((undefined8 *)CONCAT71(local_110._9_7_,local_110[8]) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)CONCAT71(local_110._9_7_,local_110[8]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0x51f,(char *)message);
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        if ((long *)CONCAT44(local_120.data_._4_4_,(uint)local_120.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_120.data_._4_4_,(uint)local_120.data_) + 8))();
        }
      }
      puVar2 = (undefined8 *)CONCAT71(local_110._9_7_,local_110[8]);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      goto LAB_00600364;
    }
  }
  testing::Message::Message((Message *)local_110);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x517,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if ((long *)local_110._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_110._0_8_ + 8))();
  }
LAB_00600364:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&local_f0);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLScreenDropFrame1920x1080Test() {
    cfg_.rc_buf_initial_sz = 50;
    cfg_.rc_buf_optimal_sz = 50;
    cfg_.rc_buf_sz = 100;
    cfg_.rc_dropframe_thresh = 30;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 52;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::Y4mVideoSource video("screendata.1920_1080.y4m", 0, 60);

    const int bitrate_array[2] = { 60, 100 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
    // Top temporal layers are non_reference, so exclude them from
    // mismatch count, since loopfilter/cdef is not applied for these on
    // encoder side, but is always applied on decoder.
    // This means 150 = #frames(300) - #TL2_frames(150).
    // We use LE for screen since loopfilter level can become very small
    // or zero and then the frame is not a mismatch.
    EXPECT_LE(GetMismatchFrames(), 150u);
#endif
  }